

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ExprMixin<(wabt::ExprType)30>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
 wabt::MakeUnique<wabt::ExprMixin<(wabt::ExprType)30>>(void)

{
  ExprMixin<(wabt::ExprType)30> *this;
  __uniq_ptr_data<wabt::ExprMixin<(wabt::ExprType)30>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>,_true,_true>
  in_RDI;
  Location local_30;
  
  this = (ExprMixin<(wabt::ExprType)30> *)operator_new(0x40);
  Location::Location(&local_30);
  ExprMixin<(wabt::ExprType)30>::ExprMixin(this,&local_30);
  std::
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)30>,std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>>>
  ::unique_ptr<std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>>,void>
            ((unique_ptr<wabt::ExprMixin<(wabt::ExprType)30>,std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::ExprMixin<(wabt::ExprType)30>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::ExprMixin<(wabt::ExprType)30>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
                .super__Head_base<0UL,_wabt::ExprMixin<(wabt::ExprType)30>_*,_false>._M_head_impl,
             this);
  return (__uniq_ptr_data<wabt::ExprMixin<(wabt::ExprType)30>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>,_true,_true>
          )(tuple<wabt::ExprMixin<(wabt::ExprType)30>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::ExprMixin<(wabt::ExprType)30>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExprMixin<(wabt::ExprType)30>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)30>_>_>
             .super__Head_base<0UL,_wabt::ExprMixin<(wabt::ExprType)30>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}